

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.h
# Opt level: O0

void __thiscall pstack::Elf::Object::~Object(Object *this)

{
  Object *this_local;
  
  std::
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                 *)(this + 0x168));
  std::unique_ptr<pstack::Elf::GnuHash,_std::default_delete<pstack::Elf::GnuHash>_>::~unique_ptr
            ((unique_ptr<pstack::Elf::GnuHash,_std::default_delete<pstack::Elf::GnuHash>_> *)
             (this + 0x160));
  std::unique_ptr<pstack::Elf::SymHash,_std::default_delete<pstack::Elf::SymHash>_>::~unique_ptr
            ((unique_ptr<pstack::Elf::SymHash,_std::default_delete<pstack::Elf::SymHash>_> *)
             (this + 0x158));
  std::shared_ptr<pstack::Elf::Object>::~shared_ptr
            ((shared_ptr<pstack::Elf::Object> *)(this + 0x148));
  std::unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>::
  ~unique_ptr((unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>
               *)(this + 0x138));
  std::unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>::
  ~unique_ptr((unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>
               *)(this + 0x130));
  std::
  map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
  ::~map((map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
          *)(this + 0x100));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)(this + 0xd0));
  std::
  vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
  ::~vector((vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
             *)(this + 0xb8));
  std::shared_ptr<pstack::Elf::Object>::~shared_ptr
            ((shared_ptr<pstack::Elf::Object> *)(this + 0x68));
  std::
  unique_ptr<pstack::Elf::SymbolVersioning,_std::default_delete<pstack::Elf::SymbolVersioning>_>::
  ~unique_ptr((unique_ptr<pstack::Elf::SymbolVersioning,_std::default_delete<pstack::Elf::SymbolVersioning>_>
               *)(this + 0x60));
  std::shared_ptr<const_pstack::Reader>::~shared_ptr
            ((shared_ptr<const_pstack::Reader> *)(this + 0x40));
  std::
  map<int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>_>_>
  ::~map((map<int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>_>_>
          *)(this + 0x10));
  std::enable_shared_from_this<pstack::Elf::Object>::~enable_shared_from_this
            ((enable_shared_from_this<pstack::Elf::Object> *)this);
  return;
}

Assistant:

~Object() noexcept = default;